

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O1

void CPU::WDC65816::ProcessorStorageConstructor::absolute_indexed_indirect_jsr
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp local_12 [10];
  
  local_12[0] = CycleFetchIncrementPC;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_12);
    local_12[1] = 0x2f;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_12 + 1);
      local_12[2] = 0x13;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_12 + 2);
        local_12[3] = 0x13;
        if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*target->_M_invoker)((_Any_data *)target,local_12 + 3);
          local_12[4] = 1;
          if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
            (*target->_M_invoker)((_Any_data *)target,local_12 + 4);
            local_12[5] = 2;
            if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
              (*target->_M_invoker)((_Any_data *)target,local_12 + 5);
              local_12[6] = 0x1d;
              if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                (*target->_M_invoker)((_Any_data *)target,local_12 + 6);
                local_12[7] = 7;
                if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                  (*target->_M_invoker)((_Any_data *)target,local_12 + 7);
                  local_12[8] = 6;
                  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                    (*target->_M_invoker)((_Any_data *)target,local_12 + 8);
                    local_12[9] = 0x2e;
                    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                      (*target->_M_invoker)((_Any_data *)target,local_12 + 9);
                      return;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

static void absolute_indexed_indirect_jsr(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);						// AAL.

		target(OperationCopyPCToData);						// Prepare to push.
		target(CyclePush);									// PCH.
		target(CyclePush);									// PCL.

		target(CycleFetchPC);								// AAH.
		target(CycleFetchPCThrowaway);						// IO.

		target(OperationConstructAbsoluteIndexedIndirect);	// Calculate data address.
		target(CycleFetchIncrementData);					// New PCL
		target(CycleFetchData);								// New PCH.
		target(OperationPerform);							// ['JSR' (actually: JMPind will do)]
	}